

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O2

bool __thiscall lzham::symbol_codec::arith_stop_encoding(symbol_codec *this)

{
  uint *puVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  ulong in_RAX;
  uint uVar5;
  bool bVar6;
  undefined8 uStack_28;
  
  bVar6 = 0x2000000 < this->m_arith_length;
  uVar5 = 0x8000;
  if (bVar6) {
    uVar5 = 0x800000;
  }
  uVar4 = (uint)bVar6 * 0x800000 + 0x800000;
  puVar1 = &this->m_arith_base;
  uVar2 = *puVar1;
  *puVar1 = *puVar1 + uVar4;
  this->m_arith_length = uVar5;
  uStack_28 = in_RAX;
  if (CARRY4(uVar2,uVar4)) {
    arith_propagate_carry(this);
  }
  bVar6 = arith_renorm_enc_interval(this);
  if (bVar6) {
    while (bVar6 = 3 < (this->m_arith_output_buf).m_size, !bVar6) {
      uStack_28 = uStack_28 & 0xffffffffffffff;
      bVar3 = vector<unsigned_char>::try_push_back
                        (&this->m_arith_output_buf,(uchar *)((long)&uStack_28 + 7));
      if (!bVar3) {
        return bVar6;
      }
      this->m_total_bits_written = this->m_total_bits_written + 8;
    }
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool symbol_codec::arith_stop_encoding()
   {
      uint orig_base = m_arith_base;

      if (m_arith_length > 2 * cSymbolCodecArithMinLen)
      {
         m_arith_base  += cSymbolCodecArithMinLen;
         m_arith_length = (cSymbolCodecArithMinLen >> 1);
      }
      else
      {
         m_arith_base  += (cSymbolCodecArithMinLen >> 1);
         m_arith_length = (cSymbolCodecArithMinLen >> 9);
      }

      if (orig_base > m_arith_base)
         arith_propagate_carry();

      if (!arith_renorm_enc_interval())
         return false;

      while (m_arith_output_buf.size() < 4)
      {
         if (!m_arith_output_buf.try_push_back(0))
            return false;
         m_total_bits_written += 8;
      }
      return true;
   }